

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O0

UBool __thiscall
icu_63::CollationWeights::allocWeights
          (CollationWeights *this,uint32_t lowerLimit,uint32_t upperLimit,int32_t n)

{
  int minLength_00;
  UBool UVar1;
  bool bVar2;
  int local_2c;
  int32_t i;
  int32_t minLength;
  int32_t n_local;
  uint32_t upperLimit_local;
  uint32_t lowerLimit_local;
  CollationWeights *this_local;
  
  UVar1 = getWeightRanges(this,lowerLimit,upperLimit);
  if (UVar1 == '\0') {
    this_local._7_1_ = '\0';
  }
  else {
    while( true ) {
      minLength_00 = this->ranges[0].length;
      UVar1 = allocWeightsInShortRanges(this,n,minLength_00);
      if (UVar1 != '\0') break;
      if (minLength_00 == 4) {
        return '\0';
      }
      UVar1 = allocWeightsInMinLengthRanges(this,n,minLength_00);
      if (UVar1 != '\0') break;
      local_2c = 0;
      while( true ) {
        bVar2 = false;
        if (local_2c < this->rangeCount) {
          bVar2 = this->ranges[local_2c].length == minLength_00;
        }
        if (!bVar2) break;
        lengthenRange(this,this->ranges + local_2c);
        local_2c = local_2c + 1;
      }
    }
    this->rangeIndex = 0;
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool
CollationWeights::allocWeights(uint32_t lowerLimit, uint32_t upperLimit, int32_t n) {
#ifdef UCOL_DEBUG
    puts("");
#endif

    if(!getWeightRanges(lowerLimit, upperLimit)) {
#ifdef UCOL_DEBUG
        printf("error: unable to get Weight ranges\n");
#endif
        return FALSE;
    }

    /* try until we find suitably large ranges */
    for(;;) {
        /* get the smallest number of bytes in a range */
        int32_t minLength=ranges[0].length;

        if(allocWeightsInShortRanges(n, minLength)) { break; }

        if(minLength == 4) {
#ifdef UCOL_DEBUG
            printf("error: the maximum number of %ld weights is insufficient for n=%ld\n",
                   minLengthCount, n);
#endif
            return FALSE;
        }

        if(allocWeightsInMinLengthRanges(n, minLength)) { break; }

        /* no good match, lengthen all minLength ranges and iterate */
#ifdef UCOL_DEBUG
        printf("lengthen the short ranges from %ld bytes to %ld and iterate\n", minLength, minLength+1);
#endif
        for(int32_t i=0; i<rangeCount && ranges[i].length==minLength; ++i) {
            lengthenRange(ranges[i]);
        }
    }

#ifdef UCOL_DEBUG
    puts("final ranges:");
    for(int32_t i=0; i<rangeCount; ++i) {
        printf("ranges[%ld] .start=0x%08lx .end=0x%08lx .length=%ld .count=%ld\n",
               i, ranges[i].start, ranges[i].end, ranges[i].length, ranges[i].count);
    }
#endif

    rangeIndex = 0;
    return TRUE;
}